

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.h
# Opt level: O1

void __thiscall jsonnet::internal::anon_unknown_0::Heap::sweep(Heap *this)

{
  pointer *pppHVar1;
  HeapEntity *pHVar2;
  pointer ppHVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  this->lastMark = this->lastMark + '\x01';
  ppHVar3 = (this->entities).
            super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->entities).
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
      ._M_impl.super__Vector_impl_data._M_finish == ppHVar3) {
    uVar5 = 0;
  }
  else {
    uVar6 = 0;
    do {
      pHVar2 = ppHVar3[uVar6];
      if (pHVar2->mark != this->lastMark) {
        if (pHVar2 != (HeapEntity *)0x0) {
          (*pHVar2->_vptr_HeapEntity[1])();
        }
        ppHVar3 = (this->entities).
                  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar4 = (long)(this->entities).
                      super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppHVar3 >> 3;
        if (uVar6 != lVar4 - 1U) {
          ppHVar3[uVar6] = ppHVar3[lVar4 + -1];
        }
        pppHVar1 = &(this->entities).
                    super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppHVar1 = *pppHVar1 + -1;
        uVar6 = uVar6 - 1;
      }
      uVar6 = uVar6 + 1;
      ppHVar3 = (this->entities).
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = (long)(this->entities).
                    super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppHVar3 >> 3;
    } while (uVar6 < uVar5);
  }
  this->numEntities = uVar5;
  this->lastNumEntities = uVar5;
  return;
}

Assistant:

void sweep(void)
    {
        lastMark++;
        // Heap shrinks during this loop.  Do not cache entities.size().
        for (unsigned long i = 0; i < entities.size(); ++i) {
            HeapEntity *x = entities[i];
            if (x->mark != lastMark) {
                delete x;
                if (i != entities.size() - 1) {
                    // Swap it with the back.
                    entities[i] = entities[entities.size() - 1];
                }
                entities.pop_back();
                --i;
            }
        }
        lastNumEntities = numEntities = entities.size();
    }